

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_binder.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::OrderBinder::CreateProjectionReference(OrderBinder *this,ParsedExpression *expr,idx_t index)

{
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *pvVar1;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  *this_00;
  reference this_01;
  pointer pPVar2;
  pointer pBVar3;
  ulong in_RCX;
  pointer *__ptr;
  size_type *this_02;
  string alias;
  __uniq_ptr_impl<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
  local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  Value local_60;
  
  local_80 = local_70;
  local_78 = 0;
  local_70[0] = 0;
  if ((expr->super_BaseExpression).alias._M_string_length != 0) {
    this_02 = &(expr->super_BaseExpression).alias._M_string_length;
    pvVar1 = optional_ptr<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
             ::operator->((optional_ptr<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
                           *)this_02);
    if (in_RCX < (ulong)((long)(pvVar1->
                               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ).
                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar1->
                               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ).
                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      this_00 = &optional_ptr<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
                 ::operator->((optional_ptr<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
                               *)this_02)->
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ;
      this_01 = ::std::
                vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ::at(this_00,in_RCX);
      pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_01);
      (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(&local_60,pPVar2);
      ::std::__cxx11::string::operator=((string *)&local_80,(string *)&local_60);
      ::std::__cxx11::string::~string((string *)&local_60);
      goto LAB_012ed3d7;
    }
  }
  if (*(long *)(index + 0x18) != 0) {
    ::std::__cxx11::string::_M_assign((string *)&local_80);
  }
LAB_012ed3d7:
  Value::UBIGINT(&local_60,in_RCX);
  make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&local_88,&local_60);
  Value::~Value(&local_60);
  pBVar3 = unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                         *)&local_88);
  ::std::__cxx11::string::operator=
            ((string *)&(pBVar3->super_Expression).super_BaseExpression.alias,(string *)&local_80);
  pBVar3 = unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                         *)&local_88);
  (pBVar3->super_Expression).super_BaseExpression.query_location.index = *(idx_t *)(index + 0x30);
  (this->binders).
  super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_88._M_t.
                super__Tuple_impl<0UL,_duckdb::BoundConstantExpression_*,_std::default_delete<duckdb::BoundConstantExpression>_>
                .super__Head_base<0UL,_duckdb::BoundConstantExpression_*,_false>._M_head_impl;
  ::std::__cxx11::string::~string((string *)&local_80);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> OrderBinder::CreateProjectionReference(ParsedExpression &expr, const idx_t index) {
	string alias;
	if (extra_list && index < extra_list->size()) {
		alias = extra_list->at(index)->ToString();
	} else {
		if (!expr.GetAlias().empty()) {
			alias = expr.GetAlias();
		}
	}
	auto result = make_uniq<BoundConstantExpression>(Value::UBIGINT(index));
	result->SetAlias(std::move(alias));
	result->SetQueryLocation(expr.GetQueryLocation());
	return std::move(result);
}